

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_set_accent_phrase.c
# Opt level: O1

void njd_set_accent_phrase(NJD *njd)

{
  char *pcVar1;
  NJDNode *node;
  long lVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  int i;
  long lVar6;
  char cVar7;
  char cVar8;
  
  if ((njd != (NJD *)0x0) && (njd->head != (NJDNode *)0x0)) {
    for (node = njd->head->next; node != (NJDNode *)0x0; node = node->next) {
      iVar4 = NJDNode_get_chain_flag(node);
      if (iVar4 < 0) {
        NJDNode_set_chain_flag(node,1);
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
          if (iVar4 == 0) {
            NJDNode_set_chain_flag(node,1);
          }
        }
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12cab0);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
          if (iVar4 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos_group1(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12cac6);
          if (iVar4 == 0) {
            pcVar5 = NJDNode_get_pos(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
            if (iVar4 == 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12dc49 + 3);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12cab0);
          if (iVar4 != 0) {
            pcVar5 = NJDNode_get_pos(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
            if (iVar4 != 0) goto LAB_0014a3d3;
          }
          NJDNode_set_chain_flag(node,0);
        }
LAB_0014a3d3:
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12cae6);
        if (iVar4 == 0) {
LAB_0014a47c:
          NJDNode_set_chain_flag(node,0);
        }
        else {
          pcVar5 = NJDNode_get_pos(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12cae6);
          if (iVar4 == 0) goto LAB_0014a47c;
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12caf0);
          if (iVar4 == 0) goto LAB_0014a47c;
          pcVar5 = NJDNode_get_pos(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12caf0);
          if (iVar4 == 0) goto LAB_0014a47c;
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12cafa);
          if (iVar4 == 0) goto LAB_0014a47c;
          pcVar5 = NJDNode_get_pos(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12cafa);
          if (iVar4 == 0) goto LAB_0014a47c;
        }
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos_group1(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_129745);
          if (iVar4 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos_group1(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_129745);
          if (iVar4 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12f1b1 + 6);
        if (iVar4 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ecd8 + 10);
        if (iVar4 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12f1b1 + 6);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12f1b1 + 6);
          if (iVar4 != 0) {
            pcVar5 = NJDNode_get_pos(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_12ecd8 + 10);
            if (iVar4 != 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ecd8 + 10);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12f1b1 + 6);
          if (iVar4 != 0) {
            pcVar5 = NJDNode_get_pos(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_12ecd8 + 10);
            if (iVar4 != 0) {
              NJDNode_set_chain_flag(node,0);
            }
          }
        }
        pcVar5 = NJDNode_get_pos_group1(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12cb2e);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
          if (iVar4 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12cab0);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos_group1(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12ef08 + 7);
          if (iVar4 == 0) {
            pcVar5 = NJDNode_get_pos(node->prev);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_12dc49 + 3);
            if (iVar4 == 0) {
              pcVar5 = NJDNode_get_cform(node->prev);
              lVar6 = 0;
              cVar3 = -0x17;
              do {
                cVar7 = cVar3;
                cVar8 = pcVar5[lVar6];
                if (cVar8 != cVar7) goto LAB_0014a5f3;
                lVar2 = lVar6 + 1;
                lVar6 = lVar6 + 1;
                cVar3 = anon_var_dwarf_12cb42[lVar2];
              } while (lVar6 != 6);
LAB_0014a9ee:
              if (cVar8 != cVar7) goto LAB_0014a5f3;
            }
            else {
              pcVar5 = NJDNode_get_pos(node->prev);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_12cab0);
              if (iVar4 == 0) {
                pcVar5 = NJDNode_get_cform(node->prev);
                lVar6 = 0;
                cVar3 = -0x17;
                do {
                  cVar7 = cVar3;
                  cVar8 = pcVar5[lVar6];
                  if (cVar8 != cVar7) goto LAB_0014a5f3;
                  lVar2 = lVar6 + 1;
                  lVar6 = lVar6 + 1;
                  cVar3 = anon_var_dwarf_12cb42[lVar2];
                } while (lVar6 != 6);
                goto LAB_0014a9ee;
              }
              pcVar5 = NJDNode_get_pos(node->prev);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_12ecd8 + 10);
              if (iVar4 != 0) goto LAB_0014a5f3;
              pcVar5 = NJDNode_get_pos_group1(node->prev);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_12ecec + 7);
              if (iVar4 != 0) goto LAB_0014a5f3;
              pcVar5 = NJDNode_get_string(node->prev);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_12a457 + 6);
              if (iVar4 != 0) {
                pcVar5 = NJDNode_get_string(node->prev);
                iVar4 = strcmp(pcVar5,anon_var_dwarf_128877);
                if (iVar4 != 0) goto LAB_0014a5f3;
              }
            }
            NJDNode_set_chain_flag(node,1);
          }
        }
LAB_0014a5f3:
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12dc49 + 3);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos_group1(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12ef08 + 7);
          if (iVar4 == 0) {
            pcVar5 = NJDNode_get_pos(node->prev);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_12dc49 + 3);
            if (iVar4 == 0) {
              pcVar5 = NJDNode_get_cform(node->prev);
              lVar6 = 0;
              cVar3 = -0x17;
              do {
                cVar8 = cVar3;
                pcVar1 = pcVar5 + lVar6;
                if (*pcVar1 != cVar8) goto LAB_0014a629;
                lVar2 = lVar6 + 1;
                lVar6 = lVar6 + 1;
                cVar3 = anon_var_dwarf_12cb42[lVar2];
              } while (lVar6 != 6);
              if (*pcVar1 == cVar8) {
LAB_0014a9ae:
                NJDNode_set_chain_flag(node,1);
              }
            }
            else {
              pcVar5 = NJDNode_get_pos(node->prev);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
              if (iVar4 == 0) {
                pcVar5 = NJDNode_get_pos_group1(node->prev);
                iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee00 + 7);
                if (iVar4 == 0) goto LAB_0014a9ae;
              }
            }
          }
        }
LAB_0014a629:
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12dc49 + 3);
          if (iVar4 != 0) {
            pcVar5 = NJDNode_get_pos(node);
            iVar4 = strcmp(pcVar5,anon_var_dwarf_12cab0);
            if (iVar4 != 0) {
              pcVar5 = NJDNode_get_pos_group1(node);
              iVar4 = strcmp(pcVar5,anon_var_dwarf_12cac6);
              if (iVar4 != 0) goto LAB_0014a694;
            }
          }
          NJDNode_set_chain_flag(node,0);
        }
LAB_0014a694:
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_127dd3);
        if (iVar4 == 0) {
LAB_0014a6cb:
          NJDNode_set_chain_flag(node,0);
        }
        else {
          pcVar5 = NJDNode_get_pos(node->prev);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_127dd3);
          if (iVar4 == 0) goto LAB_0014a6cb;
        }
        pcVar5 = NJDNode_get_pos(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12cb8a);
        if (iVar4 == 0) {
          NJDNode_set_chain_flag(node,0);
        }
        pcVar5 = NJDNode_get_pos_group3(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12cb94);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
          if (iVar4 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar5 = NJDNode_get_pos(node->prev);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee52 + 0xd);
        if (iVar4 == 0) {
          pcVar5 = NJDNode_get_pos_group3(node);
          iVar4 = strcmp(pcVar5,anon_var_dwarf_12ee5c + 3);
          if (iVar4 == 0) {
            NJDNode_set_chain_flag(node,0);
          }
        }
        pcVar5 = NJDNode_get_pos_group1(node);
        iVar4 = strcmp(pcVar5,anon_var_dwarf_12cb2e);
        if (iVar4 == 0) {
          NJDNode_set_chain_flag(node,1);
        }
      }
    }
  }
  return;
}

Assistant:

void njd_set_accent_phrase(NJD * njd)
{
   NJDNode *node;

   if (njd == NULL || njd->head == NULL)
      return;

   for (node = njd->head->next; node != NULL; node = node->next) {
      if (NJDNode_get_chain_flag(node) < 0) {
         /* Rule 01 */
         NJDNode_set_chain_flag(node, 1);

         /* Rule 02 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 1);

         /* Rule 03 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 04 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp
                (NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
                  NJDNode_set_chain_flag(node, 0);

         /* Rule 05 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
               NJDNode_set_chain_flag(node, 0);
            else if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 06 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_SETSUZOKUSHI) == 0
             || strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0
             || strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_RENTAISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 07 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU)
                == 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_FUKUSHI_KANOU) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 08 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            NJDNode_set_chain_flag(node, 1);
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            NJDNode_set_chain_flag(node, 1);

         /* Rule 09 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JODOUSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JODOUSHI) != 0 &&
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_JOSHI) != 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 10 */
         if (strcmp(NJDNode_get_pos_group1(node->prev), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
               NJDNode_set_chain_flag(node, 0);

         /* Rule 11 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KEIYOUSHI)
                          == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_JOSHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SETSUZOKUJOSHI) == 0) {
                     if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_TE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                     else if (strcmp(NJDNode_get_string(node->prev), NJD_SET_ACCENT_PHRASE_DE) == 0)
                        NJDNode_set_chain_flag(node, 1);
                  }
               }
            }

         /* Rule 12 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0)
            if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_HIJIRITSU) == 0) {
               if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0) {
                  if (strtopcmp(NJDNode_get_cform(node->prev), NJD_SET_ACCENT_PHRASE_RENYOU) != -1)
                     NJDNode_set_chain_flag(node, 1);
               } else if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
                  if (strcmp
                      (NJDNode_get_pos_group1(node->prev),
                       NJD_SET_ACCENT_PHRASE_SAHEN_SETSUZOKU) == 0)
                     NJDNode_set_chain_flag(node, 1);
               }
            }

         /* Rule 13 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0) {
            if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_DOUSHI) == 0 ||
                strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KEIYOUSHI) == 0 ||
                strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_KEIYOUDOUSHI_GOKAN) == 0)
               NJDNode_set_chain_flag(node, 0);
         }

         /* Rule 14 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_KIGOU) == 0 ||
             strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_KIGOU) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 15 */
         if (strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_SETTOUSHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 16 */
         if (strcmp(NJDNode_get_pos_group3(node->prev), NJD_SET_ACCENT_PHRASE_SEI) == 0
             && strcmp(NJDNode_get_pos(node), NJD_SET_ACCENT_PHRASE_MEISHI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 17 */
         if (strcmp(NJDNode_get_pos(node->prev), NJD_SET_ACCENT_PHRASE_MEISHI) == 0
             && strcmp(NJDNode_get_pos_group3(node), NJD_SET_ACCENT_PHRASE_MEI) == 0)
            NJDNode_set_chain_flag(node, 0);

         /* Rule 18 */
         if (strcmp(NJDNode_get_pos_group1(node), NJD_SET_ACCENT_PHRASE_SETSUBI) == 0)
            NJDNode_set_chain_flag(node, 1);
      }
   }
}